

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int gettime(float *elapse,float *elapscpu,int *status)

{
  long stopsec;
  undefined1 auStack_30 [4];
  int stopmilli;
  timeval tv;
  int *status_local;
  float *elapscpu_local;
  float *elapse_local;
  
  tv.tv_usec = (__suseconds_t)status;
  gettimeofday((timeval *)auStack_30,(__timezone_ptr_t)0x0);
  ecpu = clock();
  *elapse = (float)(_auStack_30 - startsec) + (float)((int)(tv.tv_sec / 1000) - startmilli) / 1000.0
  ;
  *elapscpu = (float)(((double)(ecpu - scpu) * 1.0) / 1000000.0);
  return *(int *)tv.tv_usec;
}

Assistant:

int gettime(float *elapse, float *elapscpu, int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */
	int stopmilli;
	long stopsec;

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);
	ecpu = clock();

        stopmilli = tv.tv_usec/1000;
	stopsec = tv.tv_sec;
	
	*elapse = (stopsec - startsec) + (stopmilli - startmilli)/1000.;
	*elapscpu = (ecpu - scpu) * 1.0 / CLOCKTICKS;
/*
printf(" (start: %ld + %d), stop: (%ld + %d) elapse: %f\n ",
startsec,startmilli,stopsec, stopmilli, *elapse);
*/
#else
/* set the elapsed time the same as the CPU time on Windows machines */
	*elapscpu = (float) ((ecpu - scpu) * 1.0 / CLOCKTICKS);
	*elapse = *elapscpu;  
#endif
	return( *status );
}